

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

void __thiscall
testing::internal::ReturnAction<ot::commissioner::Error>::
Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
::Impl(Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
       *this,shared_ptr<ot::commissioner::Error> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  element_type *peVar3;
  pointer pcVar4;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  (this->
  super_ActionInterface<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
  )._vptr_ActionInterface = (_func_int **)&PTR__Impl_0039e408;
  peVar3 = (value->super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->value_before_cast_).mCode = peVar3->mCode;
  (this->value_before_cast_).mMessage._M_dataplus._M_p =
       (pointer)&(this->value_before_cast_).mMessage.field_2;
  pcVar4 = (peVar3->mMessage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->value_before_cast_).mMessage,pcVar4,
             pcVar4 + (peVar3->mMessage)._M_string_length);
  EVar2 = (this->value_before_cast_).mCode;
  pcVar4 = (this->value_before_cast_).mMessage._M_dataplus._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar4,
             pcVar4 + (this->value_before_cast_).mMessage._M_string_length);
  (this->value_).mCode = EVar2;
  paVar1 = &(this->value_).mMessage.field_2;
  (this->value_).mMessage._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = local_30;
    *(undefined8 *)((long)&(this->value_).mMessage.field_2 + 8) = uStack_28;
  }
  else {
    (this->value_).mMessage._M_dataplus._M_p = (pointer)local_40;
    (this->value_).mMessage.field_2._M_allocated_capacity = local_30;
  }
  (this->value_).mMessage._M_string_length = local_38;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}